

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotPieChart<double>
               (char **label_ids,double *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ImGuiID key;
  ulong uVar9;
  ImPlotItem *pIVar10;
  bool bVar11;
  uint uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  double dVar16;
  double dVar17;
  ImVec4 IVar18;
  ImPlotPoint center;
  char buffer [32];
  float local_e8;
  float fStack_e4;
  ImPlotPoint local_c8;
  undefined1 local_b8 [28];
  ImU32 local_9c;
  double local_98;
  ImDrawList *local_90;
  int local_84;
  char *local_80;
  double local_78;
  char **local_70;
  double local_68;
  ImVec2 local_60;
  char local_58 [40];
  
  local_80 = fmt;
  local_70 = label_ids;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x6b2,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = double]"
                 );
  }
  local_90 = GetPlotDrawList();
  uVar14 = (ulong)(uint)count;
  local_78 = 0.0;
  if (0 < count) {
    uVar9 = 0;
    local_78 = 0.0;
    do {
      local_78 = local_78 + values[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar14 != uVar9);
  }
  bVar11 = normalize || 1.0 < local_78;
  local_c8.x = x;
  local_c8.y = y;
  PushPlotClipRect(0.0);
  dVar15 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
  local_84 = count;
  if (0 < count) {
    uVar9 = 0;
    dVar17 = dVar15;
    do {
      dVar16 = values[uVar9];
      if (bVar11) {
        dVar16 = dVar16 / local_78;
      }
      local_98 = dVar16 * 6.2831854820251465 + dVar17;
      bVar8 = BeginItem(local_70[uVar9],-1);
      if (bVar8) {
        local_9c = GImPlot->CurrentItem->Color;
        if (0.5 <= dVar16) {
          dVar16 = local_98 - dVar17;
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          dVar16 = dVar16 * 0.5 + dVar17;
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          uVar12 = (uint)((dVar16 - dVar17) * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          local_68 = (dVar16 - dVar17) / (double)(int)(uVar12 - 1);
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * local_68 + dVar17;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
          ImDrawList::AddConvexPolyFilled
                    (local_90,(ImVec2 *)
                              RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                              ::buffer,uVar12 + 1,local_9c);
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar17 = local_98 - dVar16;
          uVar12 = (uint)(dVar17 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * (dVar17 / (double)(int)(uVar12 - 1)) + dVar16;
            dVar2 = cos(dVar1);
            local_b8._0_8_ = local_c8.y;
            dVar1 = sin(dVar1);
            IVar3 = PlotToPixels(dVar2 * radius + dVar6,(double)local_b8._0_8_ + dVar1 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        else {
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar16 = local_98 - dVar17;
          uVar12 = (uint)(dVar16 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * (dVar16 / (double)(int)(uVar12 - 1)) + dVar17;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        ImDrawList::AddConvexPolyFilled
                  (local_90,(ImVec2 *)
                            RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                            ::buffer,uVar12 + 1,local_9c);
        pIVar5 = GImPlot;
        PopPlotClipRect();
        ImPlotNextItemData::Reset(&pIVar5->NextItemData);
        pIVar5->PreviousItem = pIVar5->CurrentItem;
        pIVar5->CurrentItem = (ImPlotItem *)0x0;
      }
      uVar9 = uVar9 + 1;
      dVar17 = local_98;
    } while (uVar9 != uVar14);
  }
  if ((local_80 != (char *)0x0) && (0 < local_84)) {
    uVar9 = 0;
    do {
      pIVar5 = GImPlot;
      key = ImGui::GetID(local_70[uVar9]);
      pIVar10 = ImPool<ImPlotItem>::GetByKey(&pIVar5->CurrentPlot->Items,key);
      dVar17 = values[uVar9];
      if (bVar11) {
        dVar17 = dVar17 / local_78;
      }
      dVar17 = dVar17 * 6.2831854820251465 + dVar15;
      if (pIVar10->Show == true) {
        sprintf(local_58,local_80,SUB84(values[uVar9],0));
        IVar3 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
        dVar15 = (dVar17 - dVar15) * 0.5 + dVar15;
        local_b8._0_8_ = local_c8.x;
        dVar16 = cos(dVar15);
        dVar1 = local_c8.y;
        local_b8._0_8_ = dVar16 * radius * 0.5 + (double)local_b8._0_8_;
        dVar15 = sin(dVar15);
        IVar4 = PlotToPixels((double)local_b8._0_8_,dVar1 + dVar15 * radius * 0.5,-1);
        local_b8._8_4_ = extraout_XMM0_Dc;
        local_b8._0_4_ = IVar4.x;
        local_b8._4_4_ = IVar4.y;
        local_b8._12_4_ = extraout_XMM0_Dd;
        IVar18 = ImGui::ColorConvertU32ToFloat4(pIVar10->Color);
        local_e8 = IVar3.x;
        fStack_e4 = IVar3.y;
        local_60.x = (float)local_b8._0_4_ - local_e8 * 0.5;
        local_60.y = (float)local_b8._4_4_ - fStack_e4 * 0.5;
        ImDrawList::AddText(local_90,&local_60,
                            -(uint)(IVar18.z * 0.114 + IVar18.x * 0.299 + IVar18.y * 0.587 <= 0.5) |
                            0xff000000,local_58,(char *)0x0);
      }
      uVar9 = uVar9 + 1;
      dVar15 = dVar17;
    } while (uVar14 != uVar9);
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = GetCurrentItem()->Color;
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col  = CalcTextColor(ImGui::ColorConvertU32ToFloat4(item->Color));
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}